

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

BeliefSetNonStationary * __thiscall
AlphaVectorPlanning::SampleBeliefsNonStationary
          (AlphaVectorPlanning *this,int nrBeliefs,int uniqueBeliefs,int resetAfter,
          int useQMDPforSamplingBeliefs,double QMDPexploreProb)

{
  long lVar1;
  bool bVar2;
  _Alloc_hider *p_Var3;
  int iVar4;
  PlanningUnitDecPOMDPDiscrete *pPVar5;
  size_t sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  undefined8 uVar8;
  DecPOMDPDiscreteInterface *pDVar9;
  MultiAgentDecisionProcessDiscreteInterface *pMVar10;
  void *this_00;
  int in_EDX;
  BeliefSetNonStationary *in_RDI;
  int in_R8D;
  int nrEqualFound;
  JointBeliefInterface *b1;
  JointBeliefInterface *b0;
  JointBeliefInterface *b1p;
  JointBeliefInterface *b0p;
  Index s1;
  Index s0;
  Index o;
  Index a;
  int d;
  int i;
  int nrA;
  int nrS;
  int h;
  BeliefSetNonStationary *S;
  AlphaVectorPlanning *in_stack_fffffffffffffe38;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  DecPOMDPDiscreteInterface *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffeac;
  DecPOMDPDiscreteInterface *in_stack_fffffffffffffeb0;
  double in_stack_fffffffffffffeb8;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffec0;
  allocator<char> local_c9;
  string local_c8 [32];
  int local_a8;
  undefined1 local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long *local_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  allocator<char> local_49;
  string local_48 [44];
  int local_1c;
  int local_14;
  
  local_1c = in_R8D;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  pPVar5 = GetPU(in_stack_fffffffffffffe38);
  sVar6 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar5);
  local_60 = (int)sVar6;
  GetPU(in_stack_fffffffffffffe38);
  sVar6 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffe40);
  local_64 = (int)sVar6;
  GetPU(in_stack_fffffffffffffe38);
  sVar6 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x90a032);
  local_68 = (int)sVar6;
  local_70 = 0;
  local_7c = 0;
  pPVar5 = GetPU(in_stack_fffffffffffffe38);
  iVar4 = (*(pPVar5->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar5,(long)local_64);
  local_88 = (long *)CONCAT44(extraout_var,iVar4);
  pPVar5 = GetPU(in_stack_fffffffffffffe38);
  iVar4 = (*(pPVar5->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar5,(long)local_64);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_00,iVar4);
  local_98 = local_88;
  local_90 = local_a0;
  if (local_14 <= local_60) {
    local_14 = local_60 + 1;
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling "
                            );
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_60 + 1);
    poVar7 = std::operator<<(poVar7," beliefs");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  if (local_60 != 999999) {
    local_a1 = 0;
    BeliefSetNonStationary::BeliefSetNonStationary
              ((BeliefSetNonStationary *)
               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (size_t)in_stack_fffffffffffffe68);
    local_a8 = 0;
    if (local_1c == 0) {
      local_1c = local_60;
    }
    local_6c = 0;
    while( true ) {
      bVar2 = false;
      if (local_6c < local_14) {
        bVar2 = SBORROW4(local_a8,local_14 * 2) != local_a8 + local_14 * -2 < 0;
      }
      if (!bVar2) break;
      if ((local_60 < local_70) || (local_1c < local_70)) {
        local_70 = 0;
      }
      if (local_70 == 0) {
        pPVar5 = GetPU(in_stack_fffffffffffffe38);
        pDVar9 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar5);
        local_80 = (**(code **)(*(long *)(&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb8)) +
                               0x160))(&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb8));
        lVar1 = *(long *)(*(long *)local_a0 + -0xb8);
        p_Var3 = &local_a0->_M_dataplus;
        GetPU(in_stack_fffffffffffffe38);
        pMVar10 = PlanningUnitMADPDiscrete::GetProblem((PlanningUnitMADPDiscrete *)0x90a356);
        uVar8 = (**(code **)((long)*pMVar10 + 0x50))();
        (**(code **)(*(long *)(p_Var3 + lVar1) + 0x28))(p_Var3 + lVar1,uVar8);
      }
      else {
        in_stack_fffffffffffffeb8 = (double)local_68;
        iVar4 = rand();
        local_74 = (int)(in_stack_fffffffffffffeb8 * (double)iVar4 * 4.656612873077393e-10);
        in_stack_fffffffffffffec0 = GetPU(in_stack_fffffffffffffe38);
        in_stack_fffffffffffffeb0 =
             PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(in_stack_fffffffffffffec0);
        in_stack_fffffffffffffeac =
             (**(code **)(*(long *)(&in_stack_fffffffffffffeb0->field_0x0 +
                                   *(long *)(*(long *)in_stack_fffffffffffffeb0 + -0xb8)) + 0x148))
                       (&in_stack_fffffffffffffeb0->field_0x0 +
                        *(long *)(*(long *)in_stack_fffffffffffffeb0 + -0xb8),local_7c,local_74);
        local_80 = in_stack_fffffffffffffeac;
        pPVar5 = GetPU(in_stack_fffffffffffffe38);
        pDVar9 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar5);
        local_78 = (**(code **)(*(long *)(&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb8)) +
                               0x150))(&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb8),
                                       local_74,local_80);
        (**(code **)(*(long *)local_a0 + 0xa8))(local_a0,local_98);
        in_stack_fffffffffffffe80 = local_a0;
        pPVar5 = GetPU(in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe78 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar5);
        (**(code **)(*(long *)in_stack_fffffffffffffe80 + 0xb0))
                  (in_stack_fffffffffffffe80,
                   &in_stack_fffffffffffffe78->field_0x0 +
                   *(long *)(*(long *)in_stack_fffffffffffffe78 + -0xb8),local_74,local_78);
      }
      in_stack_fffffffffffffe77 =
           BeliefSetNonStationary::Add
                     ((BeliefSetNonStationary *)in_stack_fffffffffffffec0,
                      (size_t)in_stack_fffffffffffffeb8,
                      (JointBeliefInterface *)in_stack_fffffffffffffeb0,
                      SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
      if ((bool)in_stack_fffffffffffffe77) {
        local_6c = local_6c + 1;
      }
      else {
        local_a8 = local_a8 + 1;
      }
      local_70 = local_70 + 1;
      local_7c = local_80;
      (**(code **)(*local_98 + 0xa8))(local_98,local_a0);
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    TimedAlgorithm::StopTimer
              ((TimedAlgorithm *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    if (local_6c < local_14) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Warning, only managed to sample ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_6c);
      poVar7 = std::operator<<(poVar7," unique beliefs instead of ");
      this_00 = (void *)std::ostream::operator<<(poVar7,local_14);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    return in_RDI;
  }
  uVar8 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68)
  ;
  __cxa_throw(uVar8,&E::typeinfo,E::~E);
}

Assistant:

BeliefSetNonStationary
AlphaVectorPlanning::SampleBeliefsNonStationary(
    int nrBeliefs,
    int uniqueBeliefs,
    int resetAfter,
    int useQMDPforSamplingBeliefs,
    double QMDPexploreProb) const
{
    StartTimer("SampleBeliefsNonStationary");
    
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;

    if(nrBeliefs<=h)
    {
        nrBeliefs=h+1;
        cout << "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling " << h+1 << " beliefs" << endl;
    }

    if(h==static_cast<int>(MAXHORIZON))
        throw(E("AlphaVectorPlanning::SampleBeliefsNonStationary does not make sense in an infinite-horizon setting"));

    BeliefSetNonStationary S(h);

    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
        resetAfter=h;

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<nrBeliefs)
    while(i<nrBeliefs && nrEqualFound<(nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            // sample an action uniformly at random
            a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);

            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(S.Add(d,b1,uniqueBeliefs)) // we add it
            i++;
        else
            nrEqualFound++;

        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;

    StopTimer("SampleBeliefsNonStationary");

    // we did not manage to sample nrBeliefs unique beliefs
    if(i<nrBeliefs)
    {
        cout << "Warning, only managed to sample " << i 
             << " unique beliefs instead of " << nrBeliefs << endl;
    }

    return(S);
}